

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

int proxy_conn_init(proxy_conn_handle *pc)

{
  int iVar1;
  void *pvStack_20;
  int ret;
  proxy_conn_priv *priv;
  proxy_conn_handle *pc_local;
  
  pvStack_20 = pc->priv;
  if (pvStack_20 == (void *)0x0) {
    pvStack_20 = calloc(1,0x10e8);
    if (pvStack_20 == (void *)0x0) {
      return -0xc;
    }
    pc->priv = pvStack_20;
  }
  *(char **)((long)pvStack_20 + 0x10) = pc->source_addr;
  *(char **)((long)pvStack_20 + 0x18) = pc->control_port;
  *(undefined4 *)((long)pvStack_20 + 0x20) = 1;
  iVar1 = conn_init((conn_handle *)((long)pvStack_20 + 8));
  if (iVar1 == 0) {
    *(char **)((long)pvStack_20 + 0x30) = pc->source_addr;
    *(char **)((long)pvStack_20 + 0x38) = pc->data_port;
    *(undefined4 *)((long)pvStack_20 + 0x40) = 1;
    iVar1 = conn_init((conn_handle *)((long)pvStack_20 + 0x28));
    if (iVar1 == 0) {
      *(char **)((long)pvStack_20 + 0x50) = pc->source_addr;
      *(undefined8 *)((long)pvStack_20 + 0x58) = 0;
      *(undefined4 *)((long)pvStack_20 + 0x60) = 0;
      iVar1 = conn_init((conn_handle *)((long)pvStack_20 + 0x48));
      if (((iVar1 == 0) &&
          (iVar1 = mutex_init((mutex_handle *)((long)pvStack_20 + 0x70)), iVar1 == 0)) &&
         (iVar1 = mutex_init((mutex_handle *)((long)pvStack_20 + 0x68)), iVar1 == 0)) {
        *(proxy_conn_handle **)((long)pvStack_20 + 0x88) = pc;
        *(code **)((long)pvStack_20 + 0x80) = forwarder_control;
        *(undefined4 *)((long)pvStack_20 + 0x90) = 0x100000;
        iVar1 = worker_init((worker_handle *)((long)pvStack_20 + 0x78));
        if (iVar1 == 0) {
          *(proxy_conn_handle **)((long)pvStack_20 + 0xa8) = pc;
          *(code **)((long)pvStack_20 + 0xa0) = forwarder_data;
          *(undefined4 *)((long)pvStack_20 + 0xb0) = 0x100000;
          iVar1 = worker_init((worker_handle *)((long)pvStack_20 + 0x98));
          if (iVar1 == 0) {
            *(proxy_conn_handle **)((long)pvStack_20 + 200) = pc;
            *(code **)((long)pvStack_20 + 0xc0) = forwarder_tcp;
            *(undefined4 *)((long)pvStack_20 + 0xd0) = 0x100000;
            iVar1 = worker_init((worker_handle *)((long)pvStack_20 + 0xb8));
            if (iVar1 == 0) {
              return 0;
            }
          }
        }
      }
    }
  }
  worker_free((worker_handle *)((long)pvStack_20 + 0xb8));
  worker_free((worker_handle *)((long)pvStack_20 + 0x98));
  worker_free((worker_handle *)((long)pvStack_20 + 0x78));
  mutex_free((mutex_handle *)((long)pvStack_20 + 0x68));
  mutex_free((mutex_handle *)((long)pvStack_20 + 0x70));
  conn_free((conn_handle *)((long)pvStack_20 + 0x48));
  conn_free((conn_handle *)((long)pvStack_20 + 0x28));
  conn_free((conn_handle *)((long)pvStack_20 + 8));
  free(pc->priv);
  pc->priv = (void *)0x0;
  return 0;
}

Assistant:

int proxy_conn_init(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		pc->priv = priv;
	}

	priv->conn_control.source_addr = pc->source_addr;
	priv->conn_control.source_port = pc->control_port;
	priv->conn_control.type = CONN_TYPE_UDP;
	ret = conn_init(&priv->conn_control);
	if (ret != 0)
		goto proxy_conn_init_exit;

	priv->conn_data.source_addr = pc->source_addr;
	priv->conn_data.source_port = pc->data_port;
	priv->conn_data.type = CONN_TYPE_UDP;
	ret = conn_init(&priv->conn_data);
	if (ret != 0)
		goto proxy_conn_init_exit;

	priv->conn_tcp.source_addr = pc->source_addr;
	priv->conn_tcp.source_port = NULL;
	priv->conn_tcp.type = CONN_TYPE_TCP;
	ret = conn_init(&priv->conn_tcp);
	if (ret != 0)
		goto proxy_conn_init_exit;

	ret = mutex_init(&priv->mutex_client_send);
	if (ret != 0)
		goto proxy_conn_init_exit;

	ret = mutex_init(&priv->mutex_client);
	if (ret != 0)
		goto proxy_conn_init_exit;

	priv->worker_control.func_ctx = pc;
	priv->worker_control.func_ptr = forwarder_control;
	priv->worker_control.stack_size = 1024 * 1024;
	ret = worker_init(&priv->worker_control);
	if (ret != 0)
		goto proxy_conn_init_exit;

	priv->worker_data.func_ctx = pc;
	priv->worker_data.func_ptr = forwarder_data;
	priv->worker_data.stack_size = 1024 * 1024;
	ret = worker_init(&priv->worker_data);
	if (ret != 0)
		goto proxy_conn_init_exit;

	priv->worker_tcp.func_ctx = pc;
	priv->worker_tcp.func_ptr = forwarder_tcp;
	priv->worker_tcp.stack_size = 1024 * 1024;
	ret = worker_init(&priv->worker_tcp);
	if (ret != 0)
		goto proxy_conn_init_exit;

	return 0;

proxy_conn_init_exit:
	worker_free(&priv->worker_tcp);
	worker_free(&priv->worker_data);
	worker_free(&priv->worker_control);

	mutex_free(&priv->mutex_client);
	mutex_free(&priv->mutex_client_send);

	conn_free(&priv->conn_tcp);
	conn_free(&priv->conn_data);
	conn_free(&priv->conn_control);

	free(pc->priv);
	pc->priv = NULL;

	return 0;
}